

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::detail::
build_param_type_list<bool,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&>
          (_func_bool_Type_Info_ptr_Type_Info_ptr *param_1)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffff88;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffff90;
  initializer_list<chaiscript::Type_Info> in_stack_ffffffffffffff98;
  
  user_type<bool>();
  user_type<chaiscript::Type_Info_const&>();
  user_type<chaiscript::Type_Info_const&>();
  std::allocator<chaiscript::Type_Info>::allocator((allocator<chaiscript::Type_Info> *)0x384bbf);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffff88);
  std::allocator<chaiscript::Type_Info>::~allocator((allocator<chaiscript::Type_Info> *)0x384bea);
  return in_RDI;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }